

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O0

void __thiscall tinyusdz::value::AssetPath::~AssetPath(AssetPath *this)

{
  AssetPath *this_local;
  
  ::std::__cxx11::string::~string((string *)&this->resolved_path_);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

AssetPath() = default;